

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmain.cpp
# Opt level: O1

char * log_msg_internal_1(CTcTokFileDesc *linedesc,long linenum,int *err_counter,int *warn_counter,
                         int *first_error,int *first_warning,unsigned_long options,
                         int *suppress_list,size_t suppress_cnt,tc_severity_t severity,int err)

{
  char cVar1;
  int iVar2;
  char *buf;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  char local_2038 [8208];
  
  pcVar3 = local_2038;
  if (suppress_cnt != 0 && 0xfffffffd < severity - TC_SEV_ERROR) {
    sVar4 = 0;
    do {
      if (suppress_list[sVar4] == err) {
        return (char *)0x0;
      }
      sVar4 = sVar4 + 1;
    } while (suppress_cnt != sVar4);
  }
  switch(severity) {
  case TC_SEV_PEDANTIC:
    if ((~(uint)options & 0xc) != 0) {
      return (char *)0x0;
    }
    goto LAB_0022edbc;
  case TC_SEV_WARNING:
    if ((options & 4) == 0) {
      return (char *)0x0;
    }
LAB_0022edbc:
    pcVar5 = "warning";
    if (first_warning != (int *)0x0) {
      iVar2 = *warn_counter;
      first_error = first_warning;
      goto joined_r0x0022edf6;
    }
    goto LAB_0022ee16;
  case TC_SEV_ERROR:
    pcVar5 = "error";
    break;
  case TC_SEV_FATAL:
    pcVar5 = "fatal error";
    break;
  case TC_SEV_INTERNAL:
    pcVar5 = "internal error";
    break;
  default:
    pcVar5 = "";
    goto LAB_0022ee18;
  }
  warn_counter = err_counter;
  if (first_error != (int *)0x0) {
    iVar2 = *err_counter;
joined_r0x0022edf6:
    if (iVar2 == 0) {
      *first_error = err;
    }
  }
LAB_0022ee16:
  *warn_counter = *warn_counter + 1;
LAB_0022ee18:
  if (linedesc != (CTcTokFileDesc *)0x0) {
    buf = linedesc->fname_;
    if ((options & 0x10) != 0) {
      buf = os_get_root_name(buf);
    }
    if ((options & 0x20) != 0) {
      local_2038[0] = '\"';
      do {
        if (*buf == '\"') {
          pcVar3[1] = '\"';
          pcVar3 = pcVar3 + 2;
        }
        else {
          if (*buf == '\0') goto LAB_0022ee60;
          pcVar3 = pcVar3 + 1;
        }
        cVar1 = *buf;
        buf = buf + 1;
        *pcVar3 = cVar1;
      } while( true );
    }
LAB_0022ee69:
    CTcHostIfc::print_err(G_hostifc,"%s(%ld): ",buf,linenum);
  }
  CTcHostIfc::print_err(G_hostifc,"%s",pcVar5);
  if (severity != TC_SEV_INFO && (options & 2) != 0) {
    CTcHostIfc::print_err(G_hostifc," %u",(ulong)(uint)err);
  }
  CTcHostIfc::print_err(G_hostifc,": ");
  pcVar5 = tcerr_get_msg(err,(uint)options & 1);
  pcVar3 = 
  "[Unable to find message text for this error code.  This might indicate an internal problem with the compiler, or it might be caused by an installation problem that is preventing the compiler from finding an external message file that it requires.]"
  ;
  if (pcVar5 != (char *)0x0) {
    pcVar3 = pcVar5;
  }
  return pcVar3;
LAB_0022ee60:
  pcVar3[1] = '\"';
  pcVar3[2] = '\0';
  buf = local_2038;
  goto LAB_0022ee69;
}

Assistant:

static const char *log_msg_internal_1(
    CTcTokFileDesc *linedesc, long linenum,
    int *err_counter, int *warn_counter, int *first_error, int *first_warning,
    unsigned long options, const int *suppress_list, size_t suppress_cnt,
    tc_severity_t severity, int err)
{
    const char *msg;
    const char *prefix;

    /*
     *   If this is a warning or a pedantic warning, and it's in the list of
     *   suppressed messages, ignore it entirely.  
     */
    if (severity == TC_SEV_PEDANTIC || severity == TC_SEV_WARNING)
    {
        size_t rem;
        const int *p;

        /* scan the suppress list */
        for (p = suppress_list, rem = suppress_cnt ; rem != 0 ; ++p, --rem)
        {
            /* check for a match */
            if (*p == err)
            {
                /* it's in the suppress list - ignore the error */
                return 0;
            }
        }
    }

    /* increment the appropriate counter */
    switch(severity)
    {
    case TC_SEV_INFO:
        /* 
         *   we don't need to count informational messages, and no prefix is
         *   required 
         */
        prefix = "";
        break;

    case TC_SEV_PEDANTIC:
        /* 
         *   if we're not in "pedantic" mode, or we're not even showing
         *   regular errors, ignore it 
         */
        if (!(options & TCMAIN_ERR_PEDANTIC)
            || !(options & TCMAIN_ERR_WARNINGS))
            return 0;

        /* if this is the first warning, remember the code */
        if (*warn_counter == 0 && first_warning != 0)
            *first_warning = err;

        /* count it */
        ++(*warn_counter);

        /* set the prefix */
        prefix = "warning";
        break;

    case TC_SEV_WARNING:
        /* if we're suppressing warnings, ignore it */
        if (!(options & TCMAIN_ERR_WARNINGS))
            return 0;

        /* if this is the first warning, remember the code */
        if (*warn_counter == 0 && first_warning != 0)
            *first_warning = err;

        /* count the warning */
        ++(*warn_counter);

        /* use an appropriate prefix */
        prefix = "warning";
        break;

    case TC_SEV_ERROR:
        /* if this is the first error, remember the code */
        if (*err_counter == 0 && first_error != 0)
            *first_error = err;

        /* count the error */
        ++(*err_counter);

        /* use an appropriate prefix */
        prefix = "error";
        break;

    case TC_SEV_FATAL:
        /* if this is the first error, remember the code */
        if (*err_counter == 0 && first_error != 0)
            *first_error = err;

        /* count this as an error */
        ++(*err_counter);

        /* use an appropriate prefix */
        prefix = "fatal error";
        break;

    case TC_SEV_INTERNAL:
        /* if this is the first error, remember the code */
        if (*err_counter == 0 && first_error != 0)
            *first_error = err;

        /* count this as an error */
        ++(*err_counter);

        /* use an appropriate prefix */
        prefix = "internal error";
        break;
    }

    /* display the current parsing position, if available */
    if (linedesc != 0)
    {
        const char *fname;
        char qu_buf[OSFNMAX*2 + 2];

        /* get the filename from the source descriptor */
        fname = linedesc->get_fname();

        /* 
         *   if we're in test reporting mode, show only the root part of the
         *   filename 
         */
        if ((options & TCMAIN_ERR_TESTMODE) != 0)
            fname = os_get_root_name((char *)fname);

        /* if they want quoted filenames, quote the filename */
        if ((options & TCMAIN_ERR_FNAME_QU) != 0)
        {
            const char *src;
            char *dst;

            /* quote each character of the filename */
            for (src = fname, qu_buf[0] = '"', dst = qu_buf + 1 ;
                 *src != '\0' ; )
            {
                /* if this is a quote character, stutter it */
                if (*src == '"')
                    *dst++ = '"';

                /* add this character */
                *dst++ = *src++;
            }

            /* add a closing quote and trailing null */
            *dst++ = '"';
            *dst = '\0';

            /* use the quoted version of the filename */
            fname = qu_buf;
        }

        /* show the filename and line number prefix */
        G_hostifc->print_err("%s(%ld): ", fname, linenum);
    }

    /* display the error type prefix */
    G_hostifc->print_err("%s", prefix);

    /* add the error number, if we're showing error numbers */
    if ((options & TCMAIN_ERR_NUMBERS) != 0 && severity != TC_SEV_INFO)
        G_hostifc->print_err(" %u", (unsigned int)err);

    /* add a colon and a space for separation */
    G_hostifc->print_err(": ");

    /* get the error message */
    msg = tcerr_get_msg(err, (options & TCMAIN_ERR_VERBOSE) != 0);
    if (msg == 0)
        msg = "[Unable to find message text for this error code.  "
              "This might indicate an internal problem with the compiler, "
              "or it might be caused by an installation problem that is "
              "preventing the compiler from finding an external message "
              "file that it requires.]";

    /* return the message text, so the caller can format it with arguments */
    return msg;
}